

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_write_chunk(p_ply ply,void *anybuffer,size_t size)

{
  size_t sVar1;
  ulong local_38;
  size_t i;
  char *buffer;
  size_t size_local;
  void *anybuffer_local;
  p_ply ply_local;
  
  local_38 = 0;
  if (((ply != (p_ply)0x0) && (ply->fp != (FILE *)0x0)) && (ply->io_mode == PLY_WRITE)) {
    if (0x2000 < ply->buffer_last) {
      __assert_fail("ply->buffer_last <= BUFFERSIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x432,"int ply_write_chunk(p_ply, void *, size_t)");
    }
    do {
      while( true ) {
        if (size <= local_38) {
          return 1;
        }
        if (0x1fff < ply->buffer_last) break;
        ply->buffer[ply->buffer_last] = *(char *)((long)anybuffer + local_38);
        ply->buffer_last = ply->buffer_last + 1;
        local_38 = local_38 + 1;
      }
      ply->buffer_last = 0;
      sVar1 = fwrite(ply->buffer,1,0x2000,(FILE *)ply->fp);
    } while (0x1fff < sVar1);
    return 0;
  }
  __assert_fail("ply && ply->fp && ply->io_mode == PLY_WRITE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x431,"int ply_write_chunk(p_ply, void *, size_t)");
}

Assistant:

static int ply_write_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *) anybuffer;
    size_t i = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->buffer_last <= BUFFERSIZE);
    while (i < size) {
        if (ply->buffer_last < BUFFERSIZE) {
            ply->buffer[ply->buffer_last] = buffer[i];
            ply->buffer_last++;
            i++;
        } else {
            ply->buffer_last = 0;
            if (fwrite(ply->buffer, 1, BUFFERSIZE, ply->fp) < BUFFERSIZE)
                return 0;
        }
    }
    return 1;
}